

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O2

IterateResult __thiscall
glcts::TessellationShaderTCTEgl_PatchVerticesIn::iterate
          (TessellationShaderTCTEgl_PatchVerticesIn *this)

{
  ostringstream *this_00;
  _tessellation_test_type _Var1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  uint *puVar5;
  MessageBuilder *this_01;
  TestError *this_02;
  uint *value;
  uint uVar6;
  undefined1 local_1b0 [384];
  long lVar4;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  initTest(this);
  (**(code **)(lVar4 + 0x5e0))(0x8c89);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glEnable(GL_RASTERIZER_DISCARD) call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x1005);
  value = &((this->m_tests).
            super__Vector_base<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
            ._M_impl.super__Vector_impl_data._M_start)->input_patch_size;
  while( true ) {
    if ((_test_descriptor *)(value + -6) ==
        (this->m_tests).
        super__Vector_base<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    (**(code **)(lVar4 + 0x1680))(value[-4]);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glUseProgram() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0x100c);
    _Var1 = ((_test_descriptor *)(value + -6))->type;
    if (_Var1 == TESSELLATION_TEST_TYPE_TES) {
      (**(code **)(lVar4 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,*value);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glPatchParameteriEXT() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0x1025);
      uVar6 = *value;
    }
    else {
      if (_Var1 != TESSELLATION_TEST_TYPE_FIRST) {
        this_02 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_02,"Unrecognized test type",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                   ,0x102e);
        goto LAB_00d1a62a;
      }
      uVar6 = 4;
      (**(code **)(lVar4 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,4);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glPatchParameteriEXT() for GL_PATCH_VERTICES_EXT failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0x101b);
    }
    (**(code **)(lVar4 + 0x150))(0x8c8e,8,0,0x88e4);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glBufferData() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0x1038);
    (**(code **)(lVar4 + 0x30))(0);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glBeginTransformFeedback() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0x103c);
    (**(code **)(lVar4 + 0x538))((this->super_TestCaseBase).m_glExtTokens.PATCHES,0,uVar6);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glDrawArrays() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0x1041);
    (**(code **)(lVar4 + 0x638))();
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glEndTransformFeedback() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0x1044);
    puVar5 = (uint *)(**(code **)(lVar4 + 0xd00))(0x8c8e,0,8,1);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glMapBufferRange() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0x104a);
    if ((*puVar5 != *value) || (puVar5[1] != *value)) break;
    (**(code **)(lVar4 + 0x1670))(0x8c8e);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glUnmapBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0x1060);
    value = value + 7;
  }
  local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Invalid gl_PatchVerticesIn defined for TE stage ");
  std::operator<<((ostream *)this_00," and result vertex index:");
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::operator<<((ostream *)this_00," expected:");
  this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
  std::operator<<(&(this_01->m_str).super_basic_ostream<char,_std::char_traits<char>_>," rendered:")
  ;
  std::ostream::_M_insert<unsigned_long>((ulong)&this_01->m_str);
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,"Invalid gl_PatchVerticesIn size used in TE stage",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
             ,0x105a);
LAB_00d1a62a:
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderTCTEgl_PatchVerticesIn::iterate(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initialize ES test objects */
	initTest();

	/* Prepare for rendering */
	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) call failed.");

	/* We will iterate through all added tests. */
	for (_tests_const_iterator test_iterator = m_tests.begin(); test_iterator != m_tests.end(); ++test_iterator)
	{
		/* Activate test-specific program object first. */
		gl.useProgram(test_iterator->po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed");

		/* Test type tells determines how the tessellation levels should be set.
		 * We don't need to do anything specific if TCS+TES are in, but if no
		 * TCS is present, we need to configure default amount of input patch-vertices
		 * to the test-specific value.
		 */
		glw::GLint n_patch_vertices = 0;

		switch (test_iterator->type)
		{
		case TESSELLATION_TEST_TYPE_TCS_TES:
		{
			/* We're using isolines mode which requires at least 4 input vertices per patch */
			gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 4);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() for GL_PATCH_VERTICES_EXT failed.");

			n_patch_vertices = 4;

			break;
		}

		case TESSELLATION_TEST_TYPE_TES:
		{
			gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, test_iterator->input_patch_size);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() call failed");

			n_patch_vertices = test_iterator->input_patch_size;

			break;
		}

		default:
		{
			TCU_FAIL("Unrecognized test type");
		}
		} /* switch (test_iterator->type) */

		/* Set up storage properties for the buffer object, to which XFBed data will be
		 * written.
		 **/
		const unsigned int n_bytes_needed = sizeof(int) * 2; /* the tessellator will output two vertices */

		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, n_bytes_needed, NULL /* data */, GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed");

		/* Render the test geometry */
		gl.beginTransformFeedback(GL_POINTS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed");
		{
			/* Pass a single patch only */
			gl.drawArrays(m_glExtTokens.PATCHES, 0 /* first */, n_patch_vertices);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed");
		}
		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed");

		/* Now that the BO is filled with data, map it so we can check the storage's contents */
		const int* mapped_data_ptr = (const int*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
																   n_bytes_needed, GL_MAP_READ_BIT);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed.");

		/* Verify the contents. Make sure the value we retrieved is equal to the test-specific
		 * amount of vertices per patch.
		 */
		for (unsigned int n_vertex = 0; n_vertex < 2 /* output vertices */; ++n_vertex)
		{
			unsigned int te_PatchVerticesInSize = mapped_data_ptr[n_vertex];

			if (te_PatchVerticesInSize != test_iterator->input_patch_size)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid gl_PatchVerticesIn defined for TE stage "
								   << " and result vertex index:" << n_vertex
								   << " expected:" << test_iterator->input_patch_size
								   << " rendered:" << te_PatchVerticesInSize << tcu::TestLog::EndMessage;

				TCU_FAIL("Invalid gl_PatchVerticesIn size used in TE stage");
			} /* if (comparison failed)  */
		}

		/* All done - unmap the storage */
		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");
	} /* for (all tests) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}